

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::insert_string
          (QTextDocumentPrivate *this,int pos,uint strPos,uint length,int format,Operation op)

{
  QTextFragmentData *pQVar1;
  long *plVar2;
  uint n;
  uint uVar3;
  QObject *object;
  QTextFrame *pQVar4;
  
  split(this,pos);
  n = QFragmentMapData<QTextFragmentData>::insert_single(&(this->fragments).data,pos,length);
  pQVar1 = (this->fragments).data.field_0.fragments;
  pQVar1[n].format = format;
  pQVar1[n].stringPosition = strPos;
  uVar3 = QFragmentMapData<QTextFragmentData>::previous(&(this->fragments).data,n);
  if (uVar3 != 0) {
    unite(this,uVar3);
  }
  uVar3 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
  QFragmentMap<QTextBlockData>::setSize
            (&this->blocks,uVar3,
             (this->blocks).data.field_0.fragments[uVar3].super_QFragment<3>.size_array[0] + length,
             0);
  object = &objectForFormat(this,format)->super_QObject;
  pQVar4 = QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(object);
  if (pQVar4 != (QTextFrame *)0x0) {
    plVar2 = *(long **)&(pQVar4->super_QTextObject).field_0x8;
    (**(code **)(*plVar2 + 0x20))(plVar2,(this->text).d.ptr[strPos],n);
    this->framesDirty = true;
  }
  adjustDocumentChangesAndCursors(this,pos,length,op);
  return;
}

Assistant:

void QTextDocumentPrivate::insert_string(int pos, uint strPos, uint length, int format, QTextUndoCommand::Operation op)
{
    // ##### optimize when only appending to the fragment!
    Q_ASSERT(noBlockInString(QStringView{text}.mid(strPos, length)));

    split(pos);
    uint x = fragments.insert_single(pos, length);
    QTextFragmentData *X = fragments.fragment(x);
    X->format = format;
    X->stringPosition = strPos;
    uint w = fragments.previous(x);
    if (w)
        unite(w);

    int b = blocks.findNode(pos);
    blocks.setSize(b, blocks.size(b)+length);

    Q_ASSERT(blocks.length() == fragments.length());

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(format));
    if (frame) {
        frame->d_func()->fragmentAdded(text.at(strPos), x);
        framesDirty = true;
    }

    adjustDocumentChangesAndCursors(pos, length, op);
}